

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::
emplace_back<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *this,
          IndexSetter *args)

{
  iterator pIVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *in_RDI;
  IndexSetter *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *in_stack_00000030
  ;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pIVar1 = end(in_RDI);
    (pIVar1->index).ptr = (Expression *)*in_RSI;
    (pIVar1->expr).ptr = (Expression *)in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }